

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

void Sbd_ManPrintObj(Sbd_Man_t *p,int Pivot)

{
  uint uVar1;
  word *pwVar2;
  word *pwVar3;
  Vec_Wrd_t *p_00;
  ulong uVar4;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  sbyte sVar7;
  byte bVar8;
  byte bVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  long local_48;
  
  if ((-1 < Pivot) && (Pivot < p->vObj2Var->nSize)) {
    uVar1 = p->vObj2Var->pArray[(uint)Pivot];
    uVar19 = (ulong)uVar1;
    if (-1 < (int)uVar1) {
      lVar11 = 0;
      do {
        if (p->vWinObjs->nSize <= lVar11) goto LAB_0053312d;
        uVar21 = p->vWinObjs->pArray[lVar11];
        printf("%3d : ",(ulong)uVar21);
        uVar21 = uVar21 * p->pPars->nWords;
        if (((int)uVar21 < 0) || (p->vSims[0]->nSize <= (int)uVar21)) goto LAB_0053310e;
        Extra_PrintBinary(_stdout,(uint *)(p->vSims[0]->pArray + uVar21),0x40);
        putchar(10);
        lVar11 = lVar11 + 1;
      } while (uVar19 + 1 != lVar11);
    }
    if (p->Pivot != Pivot) {
      __assert_fail("p->Pivot == Pivot",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x29b,"void Sbd_ManPrintObj(Sbd_Man_t *, int)");
    }
    p->vCounts[0]->nSize = 0;
    p->vCounts[1]->nSize = 0;
    printf("Node %d.  Useful divisors = %d.\n",(ulong)(uint)Pivot,(ulong)(uint)p->vDivValues->nSize)
    ;
    printf("Lev : ");
    if (-1 < (int)uVar1) {
      uVar17 = 0;
      do {
        if ((long)p->vWinObjs->nSize <= (long)uVar17) goto LAB_0053312d;
        iVar14 = p->vWinObjs->pArray[uVar17];
        if (uVar19 == uVar17) {
          putchar(0x20);
        }
        if ((iVar14 < 0) || (p->vLutLevs->nSize <= iVar14)) goto LAB_0053312d;
        printf("%d");
        uVar17 = uVar17 + 1;
      } while (uVar19 + 1 != uVar17);
    }
    putchar(10);
    putchar(10);
    if (0x62 < (int)uVar1) {
      printf("    : ");
      uVar17 = 0;
      do {
        if ((long)p->vWinObjs->nSize <= (long)uVar17) goto LAB_0053312d;
        if (uVar19 == uVar17) {
          putchar(0x20);
        }
        printf("%d");
        uVar17 = uVar17 + 1;
      } while (uVar19 + 1 != uVar17);
      putchar(10);
    }
    if (8 < (int)uVar1) {
      printf("    : ");
      uVar17 = 0;
      do {
        if ((long)p->vWinObjs->nSize <= (long)uVar17) goto LAB_0053312d;
        if (uVar19 == uVar17) {
          putchar(0x20);
        }
        printf("%d");
        uVar17 = uVar17 + 1;
      } while (uVar1 + 1 != uVar17);
      putchar(10);
    }
    if (-1 < (int)uVar1) {
      printf("    : ");
      uVar17 = 0;
      do {
        if ((long)p->vWinObjs->nSize <= (long)uVar17) goto LAB_0053312d;
        if (uVar19 == uVar17) {
          putchar(0x20);
        }
        printf("%d");
        uVar17 = uVar17 + 1;
      } while (uVar1 + 1 != uVar17);
      putchar(10);
      putchar(10);
    }
    iVar14 = p->pPars->nWords;
    if (0 < iVar14) {
      uVar20 = (ulong)(uVar1 + 1);
      uVar17 = 0;
      do {
        uVar21 = iVar14 * Pivot;
        if (((int)uVar21 < 0) || (p->vSims[2]->nSize <= (int)uVar21)) {
LAB_0053310e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        uVar4 = uVar17 >> 6;
        uVar16 = (uint)uVar17;
        if ((p->vSims[2]->pArray[uVar21 + uVar4] >> (uVar17 & 0x3f) & 1) != 0) {
          uVar5 = (ulong)(uVar16 & 0x3f);
          printf("%3d : ");
          sVar7 = (sbyte)(uVar16 & 0x3f);
          if (-1 < (int)uVar1) {
            uVar12 = 1L << sVar7;
            uVar18 = 0;
            do {
              if ((long)p->vWinObjs->nSize <= (long)uVar18) goto LAB_0053312d;
              uVar21 = p->pPars->nWords * p->vWinObjs->pArray[uVar18];
              if ((((int)uVar21 < 0) || (p->vSims[0]->nSize <= (int)uVar21)) ||
                 (p->vSims[2]->nSize <= (int)uVar21)) goto LAB_0053310e;
              pwVar2 = p->vSims[0]->pArray;
              pwVar3 = p->vSims[2]->pArray;
              if (uVar19 == uVar18) {
                if ((pwVar3[uVar21 + uVar4] & uVar12) != 0) {
                  Vec_IntPush(p->vCounts[(pwVar2[uVar21 + uVar4] >> uVar5 & 1) != 0],uVar16);
                }
                putchar(0x20);
              }
              if ((pwVar3[uVar21 + uVar4] & uVar12) == 0) {
                iVar14 = 0x2e;
              }
              else {
                iVar14 = ((pwVar2[uVar21 + uVar4] >> uVar5 & 1) != 0) + 0x30;
              }
              putchar(iVar14);
              uVar18 = uVar18 + 1;
            } while (uVar20 != uVar18);
          }
          putchar(10);
          printf("%3d : ",uVar17);
          if (-1 < (int)uVar1) {
            uVar17 = 1L << sVar7;
            uVar12 = 0;
            do {
              if ((long)p->vWinObjs->nSize <= (long)uVar12) goto LAB_0053312d;
              uVar21 = p->pPars->nWords * p->vWinObjs->pArray[uVar12];
              if ((((int)uVar21 < 0) || (p->vSims[0]->nSize <= (int)uVar21)) ||
                 (p->vSims[3]->nSize <= (int)uVar21)) goto LAB_0053310e;
              pwVar2 = p->vSims[0]->pArray;
              pwVar3 = p->vSims[3]->pArray;
              if (uVar19 == uVar12) {
                if ((pwVar3[uVar21 + uVar4] & uVar17) != 0) {
                  Vec_IntPush(p->vCounts[(pwVar2[uVar21 + uVar4] >> uVar5 & 1) != 0],uVar16);
                }
                putchar(0x20);
              }
              if ((pwVar3[uVar21 + uVar4] & uVar17) == 0) {
                iVar14 = 0x2e;
              }
              else {
                iVar14 = ((pwVar2[uVar21 + uVar4] >> uVar5 & 1) != 0) + 0x30;
              }
              putchar(iVar14);
              uVar12 = uVar12 + 1;
            } while (uVar20 != uVar12);
          }
          putchar(10);
          printf("Sims: ");
          if (-1 < (int)uVar1) {
            uVar17 = 0;
            do {
              if ((long)p->vWinObjs->nSize <= (long)uVar17) goto LAB_0053312d;
              uVar21 = p->pPars->nWords * p->vWinObjs->pArray[uVar17];
              if (((int)uVar21 < 0) || (p->vSims[0]->nSize <= (int)uVar21)) goto LAB_0053310e;
              pwVar2 = p->vSims[0]->pArray;
              if (uVar19 == uVar17) {
                putchar(0x20);
              }
              putchar(((pwVar2[uVar21 + uVar4] >> uVar5 & 1) != 0) + 0x30);
              uVar17 = uVar17 + 1;
            } while (uVar20 != uVar17);
          }
          putchar(10);
          printf("Ctrl: ");
          if (-1 < (int)uVar1) {
            uVar17 = 0;
            do {
              if ((long)p->vWinObjs->nSize <= (long)uVar17) goto LAB_0053312d;
              uVar21 = p->pPars->nWords * p->vWinObjs->pArray[uVar17];
              if (((int)uVar21 < 0) || (p->vSims[2]->nSize <= (int)uVar21)) goto LAB_0053310e;
              pwVar2 = p->vSims[2]->pArray;
              if (uVar19 == uVar17) {
                putchar(0x20);
              }
              putchar(((pwVar2[uVar21 + uVar4] >> uVar5 & 1) != 0) + 0x30);
              uVar17 = uVar17 + 1;
            } while (uVar20 != uVar17);
          }
          putchar(10);
          putchar(10);
        }
        uVar17 = (ulong)(uVar16 + 1);
        iVar14 = p->pPars->nWords;
      } while ((int)(uVar16 + 1) < iVar14 * 0x40);
    }
    printf("Exploring %d x %d covering table.\n",(ulong)(uint)p->vCounts[0]->nSize,
           (ulong)(uint)p->vCounts[1]->nSize);
    p->vMatrix->nSize = 0;
    pVVar10 = p->vCounts[0];
    if (0 < pVVar10->nSize) {
      local_48 = 0;
      do {
        pVVar6 = p->vCounts[1];
        if (0 < pVVar6->nSize) {
          lVar11 = (long)(pVVar10->pArray[local_48] >> 6);
          bVar8 = (byte)pVVar10->pArray[local_48] & 0x3f;
          lVar13 = 0;
          do {
            if ((int)uVar1 < 0) {
              uVar19 = 0;
            }
            else {
              uVar21 = p->vWinObjs->nSize;
              lVar15 = (long)(pVVar6->pArray[lVar13] >> 6);
              bVar9 = (byte)pVVar6->pArray[lVar13] & 0x3f;
              if ((int)uVar21 < 1) {
                uVar21 = 0;
              }
              uVar17 = 0;
              uVar19 = 0;
              do {
                if (uVar21 == uVar17) goto LAB_0053312d;
                uVar16 = p->pPars->nWords * p->vWinObjs->pArray[uVar17];
                if ((((int)uVar16 < 0) || (p->vSims[0]->nSize <= (int)uVar16)) ||
                   (p->vSims[2]->nSize <= (int)uVar16)) goto LAB_0053310e;
                pwVar2 = p->vSims[2]->pArray;
                if ((((pwVar2[(ulong)uVar16 + lVar11] & 1L << bVar8) != 0) &&
                    ((pwVar2[(ulong)uVar16 + lVar15] & 1L << bVar9) != 0)) &&
                   (pwVar2 = p->vSims[0]->pArray,
                   (((uint)(pwVar2[(ulong)uVar16 + lVar15] >> bVar9) ^
                    (uint)(pwVar2[(ulong)uVar16 + lVar11] >> bVar8)) & 1) != 0)) {
                  uVar19 = uVar19 ^ 1L << (uVar17 & 0x3f);
                }
                uVar17 = uVar17 + 1;
              } while (uVar1 + 1 != uVar17);
            }
            p_00 = p->vMatrix;
            if (0 < (long)p_00->nSize) {
              lVar15 = 0;
              do {
                if (p_00->pArray[lVar15] == uVar19) goto LAB_005330a9;
                lVar15 = lVar15 + 1;
              } while (p_00->nSize != lVar15);
            }
            Vec_WrdPush(p_00,uVar19);
            if (-1 < (int)uVar1) {
              uVar17 = 0;
              do {
                printf("%d",(ulong)((uVar19 >> (uVar17 & 0x3f) & 1) != 0));
                uVar17 = uVar17 + 1;
              } while (uVar1 + 1 != uVar17);
            }
            putchar(10);
LAB_005330a9:
            lVar13 = lVar13 + 1;
            pVVar6 = p->vCounts[1];
            iVar14 = pVVar6->nSize;
            if (0x3f < iVar14) {
              iVar14 = 0x40;
            }
          } while (lVar13 < iVar14);
        }
        local_48 = local_48 + 1;
        pVVar10 = p->vCounts[0];
        iVar14 = pVVar10->nSize;
        if (0x3f < iVar14) {
          iVar14 = 0x40;
        }
      } while (local_48 < iVar14);
    }
    return;
  }
LAB_0053312d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sbd_ManPrintObj( Sbd_Man_t * p, int Pivot )
{
    int nDivs = Vec_IntEntry(p->vObj2Var, Pivot) + 1;
    int i, k, k0, k1, Id, Bit0, Bit1;

    Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        printf( "%3d : ", Id ), Extra_PrintBinary( stdout, (unsigned *)Sbd_ObjSim0(p, Id), 64 ), printf( "\n" );

    assert( p->Pivot == Pivot );
    Vec_IntClear( p->vCounts[0] );
    Vec_IntClear( p->vCounts[1] );

    printf( "Node %d.  Useful divisors = %d.\n", Pivot, Vec_IntSize(p->vDivValues) );
    printf( "Lev : " );
    Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
    {
        if ( i == nDivs-1 )
            printf( " " );
        printf( "%d", Vec_IntEntry(p->vLutLevs, Id) );
    }
    printf( "\n" );
    printf( "\n" );

    if ( nDivs > 99 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", Id / 100 );
        }
        printf( "\n" );
    }
    if ( nDivs > 9 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", (Id % 100) / 10 );
        }
        printf( "\n" );
    }
    if ( nDivs > 0 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", Id % 10 );
        }
        printf( "\n" );
        printf( "\n" );
    }

    // sampling matrix
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        if ( !Abc_TtGetBit(Sbd_ObjSim2(p, Pivot), k) )
            continue;

        printf( "%3d : ", k );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
            {
                if ( Abc_TtGetBit(pCtrl, k) )
                    Vec_IntPush( p->vCounts[Abc_TtGetBit(pSims, k)], k );
                printf( " " );
            }
            printf( "%c", Abc_TtGetBit(pCtrl, k) ? '0' + Abc_TtGetBit(pSims, k) : '.' );
        }
        printf( "\n" );

        printf( "%3d : ", k );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim3( p, Id );
            if ( i == nDivs-1 )
            {
                if ( Abc_TtGetBit(pCtrl, k) )
                    Vec_IntPush( p->vCounts[Abc_TtGetBit(pSims, k)], k );
                printf( " " );
            }
            printf( "%c", Abc_TtGetBit(pCtrl, k) ? '0' + Abc_TtGetBit(pSims, k) : '.' );
        }
        printf( "\n" );

        printf( "Sims: " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            //word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", '0' + Abc_TtGetBit(pSims, k) );
        }
        printf( "\n" );

        printf( "Ctrl: " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            //word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", '0' + Abc_TtGetBit(pCtrl, k) );
        }
        printf( "\n" );


        printf( "\n" );
    }
    // covering table
    printf( "Exploring %d x %d covering table.\n", Vec_IntSize(p->vCounts[0]), Vec_IntSize(p->vCounts[1]) );
/*
    Vec_IntForEachEntryStop( p->vCounts[0], Bit0, k0, Abc_MinInt(Vec_IntSize(p->vCounts[0]), 8) )
    Vec_IntForEachEntryStop( p->vCounts[1], Bit1, k1, Abc_MinInt(Vec_IntSize(p->vCounts[1]), 8) )
    {
        printf( "%3d %3d : ", Bit0, Bit1 );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", (Abc_TtGetBit(pCtrl, Bit0) && Abc_TtGetBit(pCtrl, Bit1) && Abc_TtGetBit(pSims, Bit0) != Abc_TtGetBit(pSims, Bit1)) ? '1' : '.' );
        }
        printf( "\n" );
    }
*/
    Vec_WrdClear( p->vMatrix );
    Vec_IntForEachEntryStop( p->vCounts[0], Bit0, k0, Abc_MinInt(Vec_IntSize(p->vCounts[0]), 64) )
    Vec_IntForEachEntryStop( p->vCounts[1], Bit1, k1, Abc_MinInt(Vec_IntSize(p->vCounts[1]), 64) )
    {
        word Row = 0;
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( Abc_TtGetBit(pCtrl, Bit0) && Abc_TtGetBit(pCtrl, Bit1) && Abc_TtGetBit(pSims, Bit0) != Abc_TtGetBit(pSims, Bit1) )
                Abc_TtXorBit( &Row, i );
        }
        if ( Vec_WrdPushUnique( p->vMatrix, Row ) )
            continue;
        for ( i = 0; i < nDivs; i++ )
            printf( "%d", (int)((Row >> i) & 1) );
        printf( "\n" );
    }
}